

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtMinimumBase(word *t,int *pSupp,int nVarsAll,int *pnVars)

{
  int iVar1;
  uint local_3c;
  int local_38;
  int uSupp;
  int iVar;
  int v;
  int *pnVars_local;
  int nVarsAll_local;
  int *pSupp_local;
  word *t_local;
  
  local_38 = 0;
  local_3c = 0;
  if (0x10 < nVarsAll) {
    __assert_fail("nVarsAll <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x6ec,"int Abc_TtMinimumBase(word *, int *, int, int *)");
  }
  for (uSupp = 0; uSupp < nVarsAll; uSupp = uSupp + 1) {
    iVar1 = Abc_TtHasVar(t,nVarsAll,uSupp);
    if (iVar1 != 0) {
      local_3c = 1 << ((byte)uSupp & 0x1f) | local_3c;
      if (pSupp != (int *)0x0) {
        pSupp[local_38] = pSupp[uSupp];
      }
      local_38 = local_38 + 1;
    }
  }
  if (pnVars != (int *)0x0) {
    *pnVars = local_38;
  }
  if ((local_3c != 0) && (iVar1 = Abc_TtSuppIsMinBase(local_3c), iVar1 == 0)) {
    Abc_TtShrink(t,local_38,nVarsAll,local_3c);
    return 1;
  }
  return 0;
}

Assistant:

static inline int Abc_TtMinimumBase( word * t, int * pSupp, int nVarsAll, int * pnVars )
{
    int v, iVar = 0, uSupp = 0;
    assert( nVarsAll <= 16 );
    for ( v = 0; v < nVarsAll; v++ )
        if ( Abc_TtHasVar( t, nVarsAll, v ) )
        {
            uSupp |= (1 << v);
            if ( pSupp )
                pSupp[iVar] = pSupp[v];
            iVar++;
        }
    if ( pnVars )
        *pnVars = iVar;
    if ( uSupp == 0 || Abc_TtSuppIsMinBase( uSupp ) )
        return 0;
    Abc_TtShrink( t, iVar, nVarsAll, uSupp );
    return 1;
}